

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMiscTest_ParseFileOptions_Test::
ParseMiscTest_ParseFileOptions_Test(ParseMiscTest_ParseFileOptions_Test *this)

{
  ParseMiscTest_ParseFileOptions_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseMiscTest);
  (this->super_ParseMiscTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseMiscTest_ParseFileOptions_Test_02a0bca8;
  return;
}

Assistant:

TEST_F(ParseMiscTest, ParseFileOptions) {
  ExpectParsesTo(
      "option java_package = \"com.google.foo\";\n"
      "option optimize_for = CODE_SIZE;",

      "options {"
      "uninterpreted_option { name { name_part: \"java_package\" "
      "                              is_extension: false }"
      "                       string_value: \"com.google.foo\"} "
      "uninterpreted_option { name { name_part: \"optimize_for\" "
      "                              is_extension: false }"
      "                       identifier_value: \"CODE_SIZE\" } "
      "}");
}